

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O0

void set_selected_from_list(Am_Object *inter,Am_Value_List *all_objects,Am_Value_List *new_value)

{
  Am_Object this;
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Wrapper *value;
  bool old_sel;
  Am_Object current;
  Am_Value_List *new_value_local;
  Am_Value_List *all_objects_local;
  Am_Object *inter_local;
  
  current.data = (Am_Object_Data *)new_value;
  Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffd8);
  Am_Value_List::Start(all_objects);
  while (bVar1 = Am_Value_List::Last(all_objects), ((bVar1 ^ 0xffU) & 1) != 0) {
    pAVar3 = Am_Value_List::Get(all_objects);
    Am_Object::operator=((Am_Object *)&stack0xffffffffffffffd8,pAVar3);
    pAVar3 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffd8,0x172,3);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
    Am_Value_List::Start((Am_Value_List *)current.data);
    this = current;
    value = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&stack0xffffffffffffffd8);
    bVar2 = Am_Value_List::Member((Am_Value_List *)this.data,value);
    if (bVar2) {
      if (!bVar1) {
        Am_Object::Set((Am_Object *)&stack0xffffffffffffffd8,0x172,true,1);
      }
    }
    else if (bVar1) {
      Am_Object::Set((Am_Object *)&stack0xffffffffffffffd8,0x172,false,1);
    }
    Am_Value_List::Next(all_objects);
  }
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void
set_selected_from_list(Am_Object &inter, Am_Value_List &all_objects,
                       Am_Value_List &new_value)
{
  Am_Object current;
  bool old_sel;
  for (all_objects.Start(); !all_objects.Last(); all_objects.Next()) {
    current = all_objects.Get();
    old_sel = current.Get(Am_SELECTED, Am_RETURN_ZERO_ON_ERROR);
    new_value.Start();
    if (new_value.Member(current)) {
      if (!old_sel) {
        Am_REPORT_SET_SEL_VALUE(true, inter, current, true);
        current.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
      }
    } else {
      if (old_sel) {
        Am_REPORT_SET_SEL_VALUE(true, inter, current, false);
        current.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
      }
    }
  }
}